

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManCounterExampleValueStart(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  Vec_Ptr_t *p;
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pObj_00;
  int local_48;
  int local_44;
  int iBit;
  int k;
  int i;
  int nObjs;
  int Val1;
  int Val0;
  Aig_Obj_t *pObjRo;
  Aig_Obj_t *pObjRi;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  local_48 = 0;
  iVar2 = Aig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x532,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  if (pAig->pData2 != (void *)0x0) {
    __assert_fail("pAig->pData2 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x533,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar2 = pCex->iFrame;
  iVar3 = Aig_ManObjNumMax(pAig);
  iVar2 = Abc_BitWordNum((iVar2 + 1) * iVar3);
  pvVar9 = calloc((long)iVar2,4);
  pAig->pData2 = pvVar9;
  for (local_44 = 0; iVar2 = Saig_ManRegNum(pAig), local_44 < iVar2; local_44 = local_44 + 1) {
    p = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    Vec_PtrEntry(p,local_44 + iVar2);
    iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_48);
    if (iVar2 != 0) {
      __assert_fail("Abc_InfoHasBit(pCex->pData, iBit++) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x538,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    local_48 = local_48 + 1;
  }
  iVar2 = Aig_ManObjNumMax(pAig);
  for (iBit = 0; iBit <= pCex->iFrame; iBit = iBit + 1) {
    Abc_InfoSetBit((uint *)pAig->pData2,iVar2 * iBit);
    for (local_44 = 0; iVar3 = Saig_ManPiNum(pAig), local_44 < iVar3; local_44 = local_44 + 1) {
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_44);
      iVar3 = Abc_InfoHasBit((uint *)(pCex + 1),local_48);
      if (iVar3 != 0) {
        puVar1 = (uint *)pAig->pData2;
        iVar3 = Aig_ObjId(pAVar10);
        Abc_InfoSetBit(puVar1,iVar2 * iBit + iVar3);
      }
      local_48 = local_48 + 1;
    }
    for (local_44 = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_44 < iVar3; local_44 = local_44 + 1)
    {
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_44);
      if ((pAVar10 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar10), iVar3 != 0)) {
        puVar1 = (uint *)pAig->pData2;
        iVar3 = Aig_ObjFaninId0(pAVar10);
        uVar4 = Abc_InfoHasBit(puVar1,iVar2 * iBit + iVar3);
        puVar1 = (uint *)pAig->pData2;
        iVar3 = Aig_ObjFaninId1(pAVar10);
        uVar5 = Abc_InfoHasBit(puVar1,iVar2 * iBit + iVar3);
        uVar6 = Aig_ObjFaninC0(pAVar10);
        uVar7 = Aig_ObjFaninC1(pAVar10);
        if (((uVar4 ^ uVar6) & (uVar5 ^ uVar7)) != 0) {
          puVar1 = (uint *)pAig->pData2;
          iVar3 = Aig_ObjId(pAVar10);
          Abc_InfoSetBit(puVar1,iVar2 * iBit + iVar3);
        }
      }
    }
    for (local_44 = 0; iVar3 = Vec_PtrSize(pAig->vCos), local_44 < iVar3; local_44 = local_44 + 1) {
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_44);
      puVar1 = (uint *)pAig->pData2;
      iVar3 = Aig_ObjFaninId0(pAVar10);
      iVar3 = Abc_InfoHasBit(puVar1,iVar2 * iBit + iVar3);
      iVar8 = Aig_ObjFaninC0(pAVar10);
      if (iVar3 != iVar8) {
        puVar1 = (uint *)pAig->pData2;
        iVar3 = Aig_ObjId(pAVar10);
        Abc_InfoSetBit(puVar1,iVar2 * iBit + iVar3);
      }
    }
    if (iBit != pCex->iFrame) {
      for (local_44 = 0; iVar3 = Saig_ManRegNum(pAig), local_44 < iVar3; local_44 = local_44 + 1) {
        pAVar10 = Saig_ManLi(pAig,local_44);
        pObj_00 = Saig_ManLo(pAig,local_44);
        puVar1 = (uint *)pAig->pData2;
        iVar3 = Aig_ObjId(pAVar10);
        iVar3 = Abc_InfoHasBit(puVar1,iVar2 * iBit + iVar3);
        if (iVar3 != 0) {
          puVar1 = (uint *)pAig->pData2;
          iVar3 = Aig_ObjId(pObj_00);
          Abc_InfoSetBit(puVar1,iVar2 * (iBit + 1) + iVar3);
        }
      }
    }
  }
  if (local_48 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x559,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  puVar1 = (uint *)pAig->pData2;
  iVar3 = pCex->iFrame;
  pAVar10 = Aig_ManCo(pAig,pCex->iPo);
  iVar8 = Aig_ObjId(pAVar10);
  iVar2 = Abc_InfoHasBit(puVar1,iVar2 * iVar3 + iVar8);
  if (iVar2 != 0) {
    return;
  }
  __assert_fail("Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) )"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                ,0x55b,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Aig_ManCounterExampleValueStart( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int Val0, Val1, nObjs, i, k, iBit = 0;
    assert( Aig_ManRegNum(pAig) > 0 ); // makes sense only for sequential AIGs
    assert( pAig->pData2 == NULL );    // if this fail, there may be a memory leak
    // allocate memory to store simulation bits for internal nodes
    pAig->pData2 = ABC_CALLOC( unsigned, Abc_BitWordNum( (pCex->iFrame + 1) * Aig_ManObjNumMax(pAig) ) );
    // the register values in the counter-example should be zero
    Saig_ManForEachLo( pAig, pObj, k )
        assert( Abc_InfoHasBit(pCex->pData, iBit++) == 0 );
    // iterate through the timeframes
    nObjs = Aig_ManObjNumMax(pAig);
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        // set constant 1 node
        Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + 0 );
        // set primary inputs according to the counter-example
        Saig_ManForEachPi( pAig, pObj, k )
            if ( Abc_InfoHasBit(pCex->pData, iBit++) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        // compute values for each node
        Aig_ManForEachNode( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            Val1 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId1(pObj) );
            if ( (Val0 ^ Aig_ObjFaninC0(pObj)) & (Val1 ^ Aig_ObjFaninC1(pObj)) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        // derive values for combinational outputs
        Aig_ManForEachCo( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            if ( Val0 ^ Aig_ObjFaninC0(pObj) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        if ( i == pCex->iFrame )
            continue;
        // transfer values to the register output of the next frame
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            if ( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObjRi) ) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * (i+1) + Aig_ObjId(pObjRo) );
    }
    assert( iBit == pCex->nBits );
    // check that the counter-example is correct, that is, the corresponding output is asserted
    assert( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) ) );
}